

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggerC.cpp
# Opt level: O1

void defaultLogHandler(SoapySDRLogLevel logLevel,char *message)

{
  char *__format;
  
  switch(logLevel) {
  case SOAPY_SDR_FATAL:
    __format = "\x1b[1m\x1b[31m[FATAL] %s\x1b[0m\n";
    break;
  case SOAPY_SDR_CRITICAL:
    __format = "\x1b[1m\x1b[31m[CRITICAL] %s\x1b[0m\n";
    break;
  case SOAPY_SDR_ERROR:
    __format = "\x1b[1m\x1b[31m[ERROR] %s\x1b[0m\n";
    break;
  case SOAPY_SDR_WARNING:
    __format = "\x1b[1m\x1b[33m[WARNING] %s\x1b[0m\n";
    break;
  case SOAPY_SDR_NOTICE:
    __format = "\x1b[32m[NOTICE] %s\x1b[0m\n";
    break;
  case SOAPY_SDR_INFO:
    __format = "[INFO] %s\n";
    break;
  case SOAPY_SDR_DEBUG:
    __format = "[DEBUG] %s\n";
    break;
  case SOAPY_SDR_TRACE:
    __format = "[TRACE] %s\n";
    break;
  case SOAPY_SDR_SSI:
    defaultLogHandler();
    return;
  default:
    return;
  }
  fprintf(_stderr,__format,message);
  return;
}

Assistant:

static void defaultLogHandler(const SoapySDRLogLevel logLevel, const char *message)
{
    switch (logLevel)
    {
    case SOAPY_SDR_FATAL:    fprintf(stderr, ANSI_COLOR_BOLD ANSI_COLOR_RED "[FATAL] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_CRITICAL: fprintf(stderr, ANSI_COLOR_BOLD ANSI_COLOR_RED "[CRITICAL] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_ERROR:    fprintf(stderr, ANSI_COLOR_BOLD ANSI_COLOR_RED "[ERROR] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_WARNING:  fprintf(stderr, ANSI_COLOR_BOLD ANSI_COLOR_YELLOW "[WARNING] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_NOTICE:   fprintf(stderr, ANSI_COLOR_GREEN "[NOTICE] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_INFO:     fprintf(stderr, "[INFO] %s\n", message); break;
    case SOAPY_SDR_DEBUG:    fprintf(stderr, "[DEBUG] %s\n", message); break;
    case SOAPY_SDR_TRACE:    fprintf(stderr, "[TRACE] %s\n", message); break;
    case SOAPY_SDR_SSI:      fputs(message, stderr); fflush(stderr); break;
    }
}